

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_oram.h
# Opt level: O2

void __thiscall TreeOram::~TreeOram(TreeOram *this)

{
  pointer ppBVar1;
  Bucket<int> *this_00;
  vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_> *__range1;
  Bucket<int> **v;
  pointer ppBVar2;
  
  ppBVar1 = (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppBVar2 = (this->tree).super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar2 != ppBVar1; ppBVar2 = ppBVar2 + 1
      ) {
    this_00 = *ppBVar2;
    if (this_00 != (Bucket<int> *)0x0) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)this_00);
    }
    operator_delete(this_00);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->index).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>::~_Vector_base
            ((_Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_> *)this);
  return;
}

Assistant:

~TreeOram() {
         for(auto & v : tree) 
            delete v;
      }